

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryFill(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  CallInfo CVar4;
  bool bVar5;
  bool bVar6;
  undefined4 *puVar7;
  Var arg;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  int64 length;
  CallInfo callInfo_local;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length = (int64)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x24f6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b8f1b0;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])length;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_58,(CallInfo *)&length);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pTVar2 = pSVar1->threadContext;
  bVar5 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if ((length & 0x1000000U) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x24fa,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) {
LAB_00b8f1b0:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  callInfo_local = (CallInfo)0x0;
  obj = (RecyclableObject *)0x0;
  pTVar2->noJsReentrancy = bVar5;
  arg = Arguments::operator[]((Arguments *)local_58,0);
  TryGetArrayAndLength<long>
            (arg,pSVar1,L"Array.prototype.fill",(JavascriptArray **)&obj,
             (RecyclableObject **)&callInfo_local,(long *)&args.super_Arguments.Values);
  CVar4 = callInfo_local;
  FillHelper((JavascriptArray *)obj,(TypedArrayBase *)0x0,(RecyclableObject *)callInfo_local,
             (int64)args.super_Arguments.Values,(Arguments *)local_58,pSVar1);
  pTVar2->noJsReentrancy = bVar5;
  return (Var)CVar4;
}

Assistant:

Var JavascriptArray::EntryFill(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        RecyclableObject* obj = nullptr;
        JavascriptArray* pArr = nullptr;
        int64 length;

        JS_REENTRANT_UNLOCK(jsReentLock,
            TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.fill"), &pArr, &obj, &length));
        return JavascriptArray::FillHelper(pArr, nullptr, obj, length, args, scriptContext);
    }